

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ISingleStringReader.cpp
# Opt level: O2

void __thiscall ISingleStringReader::getWord(ISingleStringReader *this,string *str)

{
  char ch;
  bool bVar1;
  
  while( true ) {
    ch = std::istream::get();
    if (ch == -1) break;
    bVar1 = IDictionary::isLetter(ch);
    if (ch != ' ' && !bVar1) break;
    std::__cxx11::string::push_back((char)str);
  }
  bVar1 = std::operator!=(str,&this->m_str);
  if (bVar1) {
    std::__cxx11::string::assign((char *)str);
    return;
  }
  return;
}

Assistant:

void ISingleStringReader::getWord(std::string &str) {
    char tempChar;

    while((tempChar = this->m_ifs->get()) != EOF)
    {
        if(IDictionary::isLetter(tempChar)||tempChar==' ')
        {
            str+=tempChar;
        }
        else
            break;
    }
    if(str!=m_str)
        str="";
}